

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu1_v2.c
# Opt level: O0

MPP_RET hal_h264e_vepu1_start_v2(void *hal,HalEncTask *task)

{
  long lStack_48;
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  HalH264eVepu1Ctx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  ctx._4_4_ = MPP_NOK;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu1_v2","enter %p\n","hal_h264e_vepu1_start_v2",hal);
  }
  if (*(long *)((long)hal + 8) == 0) {
    _mpp_log_l(2,"hal_h264e_vepu1_v2","invalid NULL device ctx\n",(char *)0x0);
  }
  else {
    rd_cfg._8_8_ = (long)hal + 0x300;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
    if (ctx._4_4_ == MPP_OK) {
      lStack_48 = (long)hal + 0x590;
      rd_cfg.reg._0_4_ = 0x290;
      rd_cfg.reg._4_4_ = 0;
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&stack0xffffffffffffffb8);
      if (ctx._4_4_ == MPP_OK) {
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
        if (ctx._4_4_ != MPP_OK) {
          _mpp_log_l(2,"hal_h264e_vepu1_v2","send cmd failed %d\n","hal_h264e_vepu1_start_v2",
                     (ulong)(uint)ctx._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h264e_vepu1_v2","set register read failed %d\n","hal_h264e_vepu1_start_v2"
                   ,(ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu1_v2","set register write failed %d\n","hal_h264e_vepu1_start_v2",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu1_v2","leave %p\n","hal_h264e_vepu1_start_v2",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu1_start_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_NOK;
    HalH264eVepu1Ctx *ctx = (HalH264eVepu1Ctx *)hal;
    (void)task;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (ctx->dev) {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(ctx->regs_set);

        do {
            wr_cfg.reg = &ctx->regs_set;
            wr_cfg.size = reg_size;
            wr_cfg.offset = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
            if (ret) {
                mpp_err_f("set register write failed %d\n", ret);
                break;
            }

            rd_cfg.reg = &ctx->regs_get;
            rd_cfg.size = reg_size;
            rd_cfg.offset = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
            if (ret) {
                mpp_err_f("set register read failed %d\n", ret);
                break;
            }

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
            if (ret) {
                mpp_err_f("send cmd failed %d\n", ret);
                break;
            }
        } while (0);
    } else
        mpp_err("invalid NULL device ctx\n");

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}